

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O1

Maybe<kj::Exception> * __thiscall
kj::
runCatchingExceptions<kj::runMainAndExit(kj::ProcessContext&,kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>&&,int,char**)::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_24_3_9ec25511 *func)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  
  lVar1 = *(long *)this;
  __s = *(char **)**(undefined8 **)(this + 8);
  sVar2 = strlen(__s);
  (**(code **)**(undefined8 **)(lVar1 + 8))
            (*(undefined8 **)(lVar1 + 8),__s,sVar2 + 1,**(undefined8 **)(this + 0x10),
             (*(undefined8 **)(this + 0x10))[1]);
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}